

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-server.c
# Opt level: O1

_Bool ssh2_connection_parse_global_request(ssh2_connection_state *s,ptrlen type,PktIn *pktin)

{
  _Bool _Var1;
  char *host;
  unsigned_long uVar2;
  ptrlen pVar3;
  
  _Var1 = ptrlen_eq_string(type,"tcpip-forward");
  if (_Var1) {
    pVar3 = BinarySource_get_string(pktin->binarysource_);
    host = mkstr(pVar3);
    uVar2 = BinarySource_get_uint32(pktin->binarysource_);
    _Var1 = portfwdmgr_listen(s->portfwdmgr,host,(int)uVar2,host,(int)uVar2,s->conf);
  }
  else {
    _Var1 = ptrlen_eq_string(type,"cancel-tcpip-forward");
    if (!_Var1) {
      return false;
    }
    pVar3 = BinarySource_get_string(pktin->binarysource_);
    host = mkstr(pVar3);
    uVar2 = BinarySource_get_uint32(pktin->binarysource_);
    _Var1 = portfwdmgr_unlisten(s->portfwdmgr,host,(int)uVar2);
  }
  safefree(host);
  return _Var1;
}

Assistant:

bool ssh2_connection_parse_global_request(
    struct ssh2_connection_state *s, ptrlen type, PktIn *pktin)
{
    if (ptrlen_eq_string(type, "tcpip-forward")) {
        char *host = mkstr(get_string(pktin));
        unsigned port = get_uint32(pktin);
        /* In SSH-2, the host/port we listen on are the same host/port
         * we want reported back to us when a connection comes in,
         * because that's what we tell the client */
        bool toret = portfwdmgr_listen(
            s->portfwdmgr, host, port, host, port, s->conf);
        sfree(host);
        return toret;
    } else if (ptrlen_eq_string(type, "cancel-tcpip-forward")) {
        char *host = mkstr(get_string(pktin));
        unsigned port = get_uint32(pktin);
        bool toret = portfwdmgr_unlisten(s->portfwdmgr, host, port);
        sfree(host);
        return toret;
    } else {
        /* Unrecognised request. */
        return false;
    }
}